

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

double __thiscall chrono::curiosity::Curiosity::GetRoverMass(Curiosity *this)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  long lVar13;
  bool bVar14;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  
  peVar2 = (this->m_chassis).
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  peVar5 = (this->m_diff_bar).
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_70 = *(double *)(peVar3 + 0x2e8);
  peVar3 = (peVar5->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar5->super_CuriosityPart).m_body.
            super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_68 = *(double *)(peVar3 + 0x2e8);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_68 = *(double *)(peVar3 + 0x2e8);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  lVar13 = 0;
  local_70 = local_68 + local_70;
  bVar12 = true;
  do {
    bVar14 = bVar12;
    peVar6 = (this->m_rockers)._M_elems[lVar13].
             super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3 = (peVar6->super_CuriosityPart).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar6->super_CuriosityPart).m_body.
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> + 8))->
             _M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_68 = *(double *)(peVar3 + 0x2e8);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_68 = *(double *)(peVar3 + 0x2e8);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar7 = (this->m_bogies)._M_elems[lVar13].
             super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3 = (peVar7->super_CuriosityPart).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar7->super_CuriosityPart).m_body.
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> + 8))->
             _M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_50 = *(double *)(peVar3 + 0x2e8);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_50 = *(double *)(peVar3 + 0x2e8);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar8 = (this->m_diff_links)._M_elems[lVar13].
             super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    peVar3 = (peVar8->super_CuriosityPart).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar8->super_CuriosityPart).m_body.
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> + 8))->
             _M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_58 = *(double *)(peVar3 + 0x2e8);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_58 = *(double *)(peVar3 + 0x2e8);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar9 = (this->m_rocker_uprights)._M_elems[lVar13].
             super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3 = (peVar9->super_CuriosityPart).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar9->super_CuriosityPart).m_body.
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> + 8))->
             _M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_60 = *(double *)(peVar3 + 0x2e8);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_60 = *(double *)(peVar3 + 0x2e8);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar9 = (this->m_bogie_uprights)._M_elems[lVar13].
             super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3 = (peVar9->super_CuriosityPart).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar9->super_CuriosityPart).m_body.
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> + 8))->
             _M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_70 = local_68 + local_70 + local_50 + local_58 + local_60 + *(double *)(peVar3 + 0x2e8);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      local_70 = local_68 + local_70 + local_50 + local_58 + local_60 + *(double *)(peVar3 + 0x2e8);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    lVar13 = 1;
    bVar12 = false;
  } while (bVar14);
  lVar13 = 0x20;
  do {
    lVar10 = *(long *)((long)((this->m_wheels)._M_elems + -2) + lVar13);
    lVar11 = *(long *)(lVar10 + 0x28);
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 0x30);
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      dVar1 = *(double *)(lVar11 + 0x2e8);
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      dVar1 = *(double *)(lVar11 + 0x2e8);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    lVar13 = lVar13 + 0x10;
    local_70 = local_70 + dVar1;
  } while (lVar13 != 0x80);
  return local_70;
}

Assistant:

double Curiosity::GetRoverMass() const {
    double tot_mass = m_chassis->GetBody()->GetMass() + m_diff_bar->GetBody()->GetMass();
    for (int i = 0; i < 2; i++) {
        tot_mass = tot_mass + m_rockers[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogies[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_diff_links[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_rocker_uprights[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogie_uprights[i]->GetBody()->GetMass();
    }
    for (int i = 0; i < 6; i++) {
        tot_mass = tot_mass + m_wheels[i]->GetBody()->GetMass();
    }
    return tot_mass;
}